

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMultiphysicsInterfaceEl.h
# Opt level: O0

int __thiscall TPZMultiphysicsInterfaceElement::nmeshes(TPZMultiphysicsInterfaceElement *this)

{
  bool bVar1;
  int iVar2;
  TPZCompEl *pTVar3;
  long in_RDI;
  TPZMultiphysicsElement *mfcel_1;
  TPZMultiphysicsElement *mfcel;
  long *local_48;
  long *local_38;
  
  bVar1 = TPZCompElSide::operator_cast_to_bool((TPZCompElSide *)(in_RDI + 0x28));
  if (bVar1) {
    pTVar3 = TPZCompElSide::Element((TPZCompElSide *)(in_RDI + 0x28));
    if (pTVar3 == (TPZCompEl *)0x0) {
      local_38 = (long *)0x0;
    }
    else {
      local_38 = (long *)__dynamic_cast(pTVar3,&TPZCompEl::typeinfo,
                                        &TPZMultiphysicsElement::typeinfo,0);
    }
    if (local_38 != (long *)0x0) {
      iVar2 = (**(code **)(*local_38 + 0x270))();
      return iVar2;
    }
  }
  bVar1 = TPZCompElSide::operator_cast_to_bool((TPZCompElSide *)(in_RDI + 0x38));
  if (bVar1) {
    pTVar3 = TPZCompElSide::Element((TPZCompElSide *)(in_RDI + 0x38));
    if (pTVar3 == (TPZCompEl *)0x0) {
      local_48 = (long *)0x0;
    }
    else {
      local_48 = (long *)__dynamic_cast(pTVar3,&TPZCompEl::typeinfo,
                                        &TPZMultiphysicsElement::typeinfo,0);
    }
    if (local_48 != (long *)0x0) {
      iVar2 = (**(code **)(*local_48 + 0x270))();
      return iVar2;
    }
  }
  return 1;
}

Assistant:

virtual int nmeshes()
    {
        if (fLeftElSide) {
            TPZMultiphysicsElement *mfcel = dynamic_cast<TPZMultiphysicsElement *>(fLeftElSide.Element());
            if(mfcel)
            {
                return mfcel->NMeshes();
            }
        }
        if (fRightElSide) {
            TPZMultiphysicsElement *mfcel = dynamic_cast<TPZMultiphysicsElement *>(fRightElSide.Element()); 
            if (mfcel) {
                return mfcel->NMeshes();
            }
        }
        return 1;
    }